

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O0

void rep0_pipe_send_cb(void *arg)

{
  nni_mtx *mtx;
  nni_aio *aio_00;
  nng_err nVar1;
  nni_msg *pnVar2;
  void *item;
  size_t count;
  size_t len;
  nni_msg *msg;
  nni_aio *aio;
  rep0_ctx *ctx;
  rep0_sock *s;
  rep0_pipe *p;
  void *arg_local;
  
  mtx = *(nni_mtx **)((long)arg + 8);
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x18));
  if (nVar1 == NNG_OK) {
    nni_mtx_lock(mtx);
    *(undefined1 *)((long)arg + 0x3d0) = 0;
    item = nni_list_first((nni_list *)((long)arg + 0x3b8));
    if (item == (void *)0x0) {
      if (*(int *)((long)arg + 0x10) == mtx[4].mtx.__data.__lock) {
        nni_pollable_raise((nni_pollable *)&mtx[7].mtx.__data.__list.__next);
      }
      nni_mtx_unlock(mtx);
    }
    else {
      nni_list_remove((nni_list *)((long)arg + 0x3b8),item);
      aio_00 = *(nni_aio **)((long)item + 0x18);
      *(undefined8 *)((long)item + 0x18) = 0;
      *(undefined8 *)((long)item + 0x10) = 0;
      *(undefined1 *)((long)arg + 0x3d0) = 1;
      pnVar2 = nni_aio_get_msg(aio_00);
      count = nni_msg_len(pnVar2);
      nni_aio_set_msg(aio_00,(nni_msg *)0x0);
      nni_aio_set_msg((nni_aio *)((long)arg + 0x18),pnVar2);
      nni_pipe_send(*arg,(nni_aio *)((long)arg + 0x18));
      nni_mtx_unlock(mtx);
      nni_aio_finish_sync(aio_00,NNG_OK,count);
    }
  }
  else {
    pnVar2 = nni_aio_get_msg((nni_aio *)((long)arg + 0x18));
    nni_msg_free(pnVar2);
    nni_aio_set_msg((nni_aio *)((long)arg + 0x18),(nni_msg *)0x0);
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
rep0_pipe_send_cb(void *arg)
{
	rep0_pipe *p = arg;
	rep0_sock *s = p->rep;
	rep0_ctx  *ctx;
	nni_aio   *aio;
	nni_msg   *msg;
	size_t     len;

	if (nni_aio_result(&p->aio_send) != 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->pipe);
		return;
	}
	nni_mtx_lock(&s->lk);
	p->busy = false;
	if ((ctx = nni_list_first(&p->sendq)) == NULL) {
		// Nothing else to send.
		if (p->id == s->ctx.pipe_id) {
			// Mark us ready for the other side to send!
			nni_pollable_raise(&s->writable);
		}
		nni_mtx_unlock(&s->lk);
		return;
	}

	nni_list_remove(&p->sendq, ctx);
	aio        = ctx->saio;
	ctx->saio  = NULL;
	ctx->spipe = NULL;
	p->busy    = true;
	msg        = nni_aio_get_msg(aio);
	len        = nni_msg_len(msg);
	nni_aio_set_msg(aio, NULL);
	nni_aio_set_msg(&p->aio_send, msg);
	nni_pipe_send(p->pipe, &p->aio_send);

	nni_mtx_unlock(&s->lk);

	nni_aio_finish_sync(aio, 0, len);
}